

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O0

bool __thiscall CheckStructure::isMain(CheckStructure *this,string *nameMain)

{
  __type _Var1;
  reference pvVar2;
  __type local_111;
  allocator local_f1;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [35];
  byte local_6d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *nameMain_local;
  CheckStructure *this_local;
  
  local_20 = nameMain;
  nameMain_local = &this->m_sMainType;
  _Var1 = std::operator==(nameMain,&this->nMain);
  if (_Var1) {
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)nameMain);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->delimiters,5);
    _Var1 = std::operator==(local_40,pvVar2);
    local_6d = 0;
    local_111 = false;
    if (_Var1) {
      std::__cxx11::string::substr((ulong)local_60,(ulong)nameMain);
      local_6d = 1;
      local_111 = std::operator==(local_60,&this->nMain);
    }
    if ((local_6d & 1) != 0) {
      std::__cxx11::string::~string((string *)local_60);
    }
    std::__cxx11::string::~string((string *)local_40);
    if (local_111 == false) {
      std::__cxx11::string::substr((ulong)local_d0,(ulong)nameMain);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->delimiters,0);
      _Var1 = std::operator==(local_d0,pvVar2);
      std::__cxx11::string::~string((string *)local_d0);
      if (_Var1) {
        this->m_countCalls = this->m_countCalls + 1;
        this_local._7_1_ = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"wrong name of main func",&local_f1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_errors,(value_type *)local_f0);
        std::__cxx11::string::~string(local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        this_local._7_1_ = false;
      }
    }
    else {
      this->m_countCalls = this->m_countCalls + 2;
      std::__cxx11::string::substr((ulong)local_90,(ulong)nameMain);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->delimiters,2);
      _Var1 = std::operator==(local_90,pvVar2);
      std::__cxx11::string::~string((string *)local_90);
      if (_Var1) {
        this->m_countCalls = this->m_countCalls + 1;
        std::__cxx11::string::substr((ulong)local_b0,(ulong)nameMain);
        _Var1 = std::operator==(local_b0,&this->nReturn);
        std::__cxx11::string::~string((string *)local_b0);
        if (_Var1) {
          this->m_countCalls = this->m_countCalls + 1;
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CheckStructure::isMain(string nameMain) {
    if (nameMain == nMain)
        return true;
    if ((nameMain.substr(4, 2) == delimiters[5]) && (nameMain.substr(0, 4) == nMain)) {
        m_countCalls += 2;
        if (nameMain.substr(6, 1) == delimiters[2]) {
            m_countCalls++;
            if (nameMain.substr(7, 6) == nReturn)
                m_countCalls++;
        }
        return true;
    }
    if (nameMain.substr(4, 1) == delimiters[0]) {
        m_countCalls++;
        return true;
    }
    m_errors.push_back("wrong name of main func");
    return false;
}